

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatProviders.h
# Opt level: O2

void __thiscall
llvm::format_provider<llvm::StringLiteral,_void>::format
          (format_provider<llvm::StringLiteral,_void> *this,StringLiteral *V,raw_ostream *Stream,
          StringRef Style)

{
  type_conflict1 tVar1;
  size_t sVar2;
  StringRef Str;
  undefined1 local_30 [8];
  StringRef Style_local;
  size_t N;
  
  Style_local.Data = Style.Data;
  Style_local.Length = 0xffffffffffffffff;
  local_30 = (undefined1  [8])Stream;
  if ((Style_local.Data != (char *)0x0) &&
     (tVar1 = StringRef::getAsInteger<unsigned_long>((StringRef *)local_30,10,&Style_local.Length),
     tVar1)) {
    __assert_fail("false && \"Style is not a valid integer\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/Support/FormatProviders.h"
                  ,0xcd,
                  "static void llvm::format_provider<llvm::StringLiteral>::format(const T &, llvm::raw_ostream &, StringRef) [T = llvm::StringLiteral, Enable = void]"
                 );
  }
  sVar2 = Style_local.Length;
  if (*(ulong *)(this + 8) < Style_local.Length) {
    sVar2 = *(ulong *)(this + 8);
  }
  Str.Length = sVar2;
  Str.Data = *(char **)this;
  raw_ostream::operator<<((raw_ostream *)V,Str);
  return;
}

Assistant:

static void format(const T &V, llvm::raw_ostream &Stream, StringRef Style) {
    size_t N = StringRef::npos;
    if (!Style.empty() && Style.getAsInteger(10, N)) {
      assert(false && "Style is not a valid integer");
    }
    llvm::StringRef S = V;
    Stream << S.substr(0, N);
  }